

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O3

void DC16NoTop_C(uint8_t *dst)

{
  uint8_t *puVar1;
  int DC;
  long lVar2;
  undefined1 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  
  DC = 8;
  lVar2 = -1;
  do {
    DC = DC + (uint)dst[lVar2];
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x1ff);
  lVar2 = 0;
  uVar3 = (undefined1)((uint)DC >> 4);
  auVar5 = ZEXT216(CONCAT11(uVar3,uVar3));
  auVar5 = pshuflw(auVar5,auVar5,0);
  uVar4 = auVar5._0_4_;
  do {
    puVar1 = dst + lVar2;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 8) = uVar4;
    *(undefined4 *)(puVar1 + 0xc) = uVar4;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x200);
  return;
}

Assistant:

static void DC16NoTop_C(uint8_t* dst) {   // DC with top samples not available
  int DC = 8;
  int j;
  for (j = 0; j < 16; ++j) {
    DC += dst[-1 + j * BPS];
  }
  Put16(DC >> 4, dst);
}